

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llhttp.c
# Opt level: O3

llparse_match_t
llparse__match_sequence_id(llhttp__internal_t *s,uchar *p,uchar *endp,uchar *seq,uint32_t seq_len)

{
  uint uVar1;
  uchar uVar2;
  uchar uVar3;
  char cVar4;
  ulong uVar5;
  ulong in_RAX;
  uchar *puVar6;
  uint uVar7;
  llparse_match_t lVar8;
  
  uVar7 = s->_index;
  puVar6 = p;
  if (p != endp) {
    do {
      uVar1 = uVar7 + 1;
      uVar5 = 0;
      if (uVar1 != seq_len) {
        uVar5 = in_RAX & 0xffffffff;
      }
      in_RAX = uVar5;
      uVar2 = *puVar6;
      uVar3 = seq[uVar7];
      if (uVar2 != uVar3) {
        in_RAX = 2;
      }
      cVar4 = (uVar1 == seq_len) * '\x05';
      if (uVar2 != uVar3) {
        cVar4 = '\x05';
      }
      if (cVar4 != '\0') {
        if (cVar4 != '\x05') goto LAB_00108186;
        uVar7 = 0;
        goto LAB_00108184;
      }
      if (uVar2 != uVar3) {
        uVar1 = uVar7;
      }
      uVar7 = uVar1;
      puVar6 = puVar6 + 1;
      p = endp;
    } while (puVar6 != endp);
  }
  in_RAX = 1;
  puVar6 = p;
LAB_00108184:
  s->_index = uVar7;
LAB_00108186:
  lVar8.current = puVar6;
  lVar8._0_8_ = in_RAX;
  return lVar8;
}

Assistant:

static llparse_match_t llparse__match_sequence_id(
    llhttp__internal_t* s, const unsigned char* p,
    const unsigned char* endp,
    const unsigned char* seq, uint32_t seq_len) {
  uint32_t index;
  llparse_match_t res;

  index = s->_index;
  for (; p != endp; p++) {
    unsigned char current;

    current = *p;
    if (current == seq[index]) {
      if (++index == seq_len) {
        res.status = kMatchComplete;
        goto reset;
      }
    } else {
      res.status = kMatchMismatch;
      goto reset;
    }
  }
  s->_index = index;
  res.status = kMatchPause;
  res.current = p;
  return res;
reset:
  s->_index = 0;
  res.current = p;
  return res;
}